

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O3

void __thiscall eglu::Error::Error(Error *this,deUint32 errCode,char *errStr)

{
  long *plVar1;
  long *plVar2;
  bool *expr;
  long *message;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"EGL returned ","");
  getErrorName(errCode);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_48);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    message = &local_58;
  }
  else {
    local_58 = *plVar2;
    message = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  expr = deqp::gles31::Functional::SSBOArrayLengthTests::init::arraysSized + 1;
  if (errStr != (char *)0x0) {
    expr = (bool *)errStr;
  }
  tcu::TestError::TestError
            (&this->super_TestError,(char *)message,expr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluDefs.cpp"
             ,0x38);
  if (message != &local_58) {
    operator_delete(message,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  *(undefined ***)&(this->super_TestError).super_TestException.super_Exception =
       &PTR__Exception_00b26030;
  *(deUint32 *)&(this->super_TestError).super_TestException.field_0x34 = errCode;
  return;
}

Assistant:

Error::Error (deUint32 errCode, const char* errStr)
	: tcu::TestError	((std::string("EGL returned ") + getErrorName(errCode)).c_str(), errStr ? errStr : "", __FILE__, __LINE__)
	, m_error			(errCode)
{
}